

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O2

void __thiscall Am_Value_List_Data::Print(Am_Value_List_Data *this,ostream *os)

{
  Am_List_Item *value;
  ostream *poVar1;
  Am_List_Item **ppAVar2;
  Am_Value v;
  Am_Value local_30;
  
  poVar1 = std::operator<<(os,"LIST(");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(uint)*(ushort *)&(this->super_Am_Wrapper).field_0xc);
  std::operator<<(poVar1,") [");
  local_30.type = 0;
  local_30.value.wrapper_value = (Am_Wrapper *)0x0;
  ppAVar2 = &this->head;
  while (value = *ppAVar2, value != this->tail) {
    poVar1 = ::operator<<(os,&value->super_Am_Value);
    std::operator<<(poVar1,", ");
    ppAVar2 = &value->next;
  }
  if (value != (Am_List_Item *)0x0) {
    ::operator<<(os,&value->super_Am_Value);
  }
  std::operator<<(os,"]");
  Am_Value::~Am_Value(&local_30);
  return;
}

Assistant:

void
Am_Value_List_Data::Print(std::ostream &os) const
{
  Am_List_Item *current;
  os << "LIST(" << (int)number << ") [";
  Am_Value v;
  for (current = head; current != tail; current = current->next) {
    os << *current << ", ";
  }
  if (current) {
    os << *current;
  }
  os << "]";
}